

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

char * search_header(curl_slist *hdrlist,char *hdr)

{
  size_t len;
  char *pcVar1;
  
  len = strlen(hdr);
  if (hdrlist != (curl_slist *)0x0) {
    do {
      pcVar1 = match_header(hdrlist,hdr,len);
      if (pcVar1 != (char *)0x0) {
        return pcVar1;
      }
      hdrlist = hdrlist->next;
    } while (hdrlist != (curl_slist *)0x0);
  }
  return (char *)0x0;
}

Assistant:

static char *search_header(struct curl_slist *hdrlist, const char *hdr)
{
  size_t len = strlen(hdr);
  char *value = NULL;

  for(; !value && hdrlist; hdrlist = hdrlist->next)
    value = match_header(hdrlist, hdr, len);

  return value;
}